

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O1

void re_fastputc(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wint_t **ppwVar3;
  int iVar4;
  long lVar5;
  wint_t *pwVar6;
  wint_t c_00;
  wchar_t wVar7;
  wint_t c_01;
  ulong uVar8;
  
  iVar4 = wcwidth(c);
  while ((1 < iVar4 && ((el->el_terminal).t_size.h < (el->el_cursor).h + iVar4))) {
    re_fastputc(el,0x20);
  }
  terminal__putc(el,c);
  ppwVar3 = el->el_display;
  pwVar6 = ppwVar3[(el->el_cursor).v];
  wVar1 = (el->el_cursor).h;
  (el->el_cursor).h = wVar1 + L'\x01';
  pwVar6[wVar1] = c;
  if (1 < iVar4) {
    iVar4 = iVar4 + 1;
    do {
      pwVar6 = ppwVar3[(el->el_cursor).v];
      wVar1 = (el->el_cursor).h;
      (el->el_cursor).h = wVar1 + L'\x01';
      pwVar6[wVar1] = 0xffffffff;
      iVar4 = iVar4 + -1;
    } while (2 < iVar4);
  }
  wVar1 = (el->el_terminal).t_size.h;
  lVar5 = (long)wVar1;
  if ((el->el_cursor).h < wVar1) {
    return;
  }
  (el->el_cursor).h = L'\0';
  wVar2 = (el->el_terminal).t_size.v;
  wVar7 = (el->el_cursor).v + L'\x01';
  if (wVar7 < wVar2) {
    (el->el_cursor).v = wVar7;
    wVar2 = (el->el_refresh).r_oldcv;
    (el->el_refresh).r_oldcv = wVar2 + L'\x01';
    pwVar6 = ppwVar3[(long)wVar2 + 1];
  }
  else {
    pwVar6 = *ppwVar3;
    uVar8 = 1;
    if (L'\x01' < wVar2) {
      do {
        el->el_display[uVar8 - 1] = el->el_display[uVar8];
        uVar8 = uVar8 + 1;
      } while ((uint)wVar2 != uVar8);
    }
    el->el_display[uVar8 - 1] = pwVar6;
  }
  if (wVar1 != L'\0') {
    do {
      *pwVar6 = 0x20;
      pwVar6 = pwVar6 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  *pwVar6 = 0;
  wVar1 = (el->el_terminal).t_flags;
  if ((char)wVar1 < '\0') {
    if (((uint)wVar1 >> 8 & 1) == 0) {
      return;
    }
    c_00 = 8;
    c_01 = 0x20;
  }
  else {
    c_00 = 10;
    c_01 = 0xd;
  }
  terminal__putc(el,c_01);
  terminal__putc(el,c_00);
  return;
}

Assistant:

static void
re_fastputc(EditLine *el, wint_t c)
{
	wint_t *lastline;
	int w;

	w = wcwidth(c);
	while (w > 1 && el->el_cursor.h + w > el->el_terminal.t_size.h)
	    re_fastputc(el, ' ');

	terminal__putc(el, c);
	el->el_display[el->el_cursor.v][el->el_cursor.h++] = c;
	while (--w > 0)
		el->el_display[el->el_cursor.v][el->el_cursor.h++]
			= MB_FILL_CHAR;

	if (el->el_cursor.h >= el->el_terminal.t_size.h) {
		/* if we must overflow */
		el->el_cursor.h = 0;

		/*
		 * If we would overflow (input is longer than terminal size),
		 * emulate scroll by dropping first line and shuffling the rest.
		 * We do this via pointer shuffling - it's safe in this case
		 * and we avoid memcpy().
		 */
		if (el->el_cursor.v + 1 >= el->el_terminal.t_size.v) {
			int i, lins = el->el_terminal.t_size.v;

			lastline = el->el_display[0];
			for(i = 1; i < lins; i++)
				el->el_display[i - 1] = el->el_display[i];

			el->el_display[i - 1] = lastline;
		} else {
			el->el_cursor.v++;
			lastline = el->el_display[++el->el_refresh.r_oldcv];
		}
		re__copy_and_pad((wchar_t *)lastline, L"",
		    (size_t)el->el_terminal.t_size.h);

		if (EL_HAS_AUTO_MARGINS) {
			if (EL_HAS_MAGIC_MARGINS) {
				terminal__putc(el, ' ');
				terminal__putc(el, '\b');
			}
		} else {
			terminal__putc(el, '\r');
			terminal__putc(el, '\n');
		}
	}
}